

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

bool __thiscall Test::Suite::run(Suite *this,Output *out,bool continueOnError)

{
  int iVar1;
  undefined7 in_register_00000011;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> vStack_38;
  
  (*this->_vptr_Suite[4])(&vStack_38,this);
  iVar1 = (*this->_vptr_Suite[3])
                    (this,out,&vStack_38,CONCAT71(in_register_00000011,continueOnError) & 0xffffffff
                    );
  std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::~vector(&vStack_38);
  return SUB41(iVar1,0);
}

Assistant:

bool Suite::run(Output &out, bool continueOnError) { return run(out, listTests(), continueOnError); }